

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O0

bool dis_test(vw *all,example *ec,single_learner *base,float param_4,float threshold)

{
  long in_RSI;
  long *in_RDI;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  bool result;
  float loss_delta;
  float k;
  float middle;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  if (3.0 < *(double *)(*in_RDI + 0x18) + (double)*(float *)(in_RSI + 0x6870)) {
    fVar1 = *(float *)(in_RSI + 0x6850) - 0.0;
    fVar2 = ABS(fVar1);
    fVar1 = LEARNER::learner<char,_example>::sensitivity
                      ((learner<char,_example> *)(ulong)in_stack_ffffffffffffffd0,
                       (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       CONCAT44(fVar1,in_stack_ffffffffffffffc0) & 0x7fffffffffffffff);
    *(float *)(in_RSI + 0x68b8) = fVar2 / fVar1;
    local_1 = *(float *)(in_RSI + 0x68b8) / (float)*(double *)(*in_RDI + 0x18) <= in_XMM1_Da;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool dis_test(vw& all, example& ec, single_learner& base, float /* prediction */, float threshold)
{
  if (all.sd->t + ec.weight <= 3)
  {
    return true;
  }

  // Get loss difference
  float middle = 0.f;
  ec.confidence = fabsf(ec.pred.scalar - middle) / base.sensitivity(ec);

  float k = (float)all.sd->t;
  float loss_delta = ec.confidence / k;

  bool result = (loss_delta <= threshold);

  return result;
}